

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::GetTextureSubImage::Functional::iterate(Functional *this)

{
  ostringstream *this_00;
  GLenum GVar1;
  RenderContext *pRVar2;
  bool bVar3;
  bool bVar4;
  ContextType ctxType;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar6;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  long lVar7;
  undefined1 local_1b0 [384];
  
  ctxType.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_get_texture_sub_image");
  pRVar2 = this->m_context->m_renderCtx;
  iVar5 = (*pRVar2->_vptr_RenderContext[7])(pRVar2,"glGetCompressedTextureSubImage");
  this->m_gl_GetCompressedTextureSubImage =
       (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)CONCAT44(extraout_var,iVar5);
  iVar5 = (*this->m_context->m_renderCtx->_vptr_RenderContext[7])();
  this->m_gl_GetTextureSubImage = (PFNGLGETTEXTURESUBIMAGEPROC)CONCAT44(extraout_var_00,iVar5);
  if (((PFNGLGETTEXTURESUBIMAGEPROC)CONCAT44(extraout_var_00,iVar5) ==
       (PFNGLGETTEXTURESUBIMAGEPROC)0x0) ||
     (this->m_gl_GetCompressedTextureSubImage == (PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)0x0)) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "Cannot obtain glGetCompressedTextureSubImage or glGetTextureSubImage function pointer."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0;
    __cxa_throw(puVar6,&int::typeinfo,0);
  }
  if (bVar3 || bVar4) {
    bVar3 = true;
    for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 4) {
      GVar1 = *(GLenum *)((long)&DAT_01665380 + lVar7);
      prepare(this,GVar1,false);
      bVar4 = check(this,GVar1,false);
      clean(this);
      bVar3 = bVar4 && bVar3;
    }
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 4) {
      GVar1 = *(GLenum *)((long)&DAT_016653a0 + lVar7);
      prepare(this,GVar1,true);
      bVar4 = check(this,GVar1,true);
      clean(this);
      bVar3 = bVar4 && bVar3;
    }
    if (!bVar3) {
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_00978c6f;
    }
  }
  this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_00978c6f:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl4cts::GetTextureSubImage::Functional::iterate(void)
{
	bool is_ok		= true;
	bool test_error = false;

	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_get_texture_sub_image = m_context.getContextInfo().isExtensionSupported("GL_ARB_get_texture_sub_image");

	/* Bind function pointers. */
	m_gl_GetCompressedTextureSubImage =
		(PFNGLGETCOMPRESSEDTEXTURESUBIMAGEPROC)m_context.getRenderContext().getProcAddress(
			"glGetCompressedTextureSubImage");
	m_gl_GetTextureSubImage =
		(PFNGLGETTEXTURESUBIMAGEPROC)m_context.getRenderContext().getProcAddress("glGetTextureSubImage");

	try
	{
		/* Report error when function pointers are not available. */
		if ((DE_NULL == m_gl_GetCompressedTextureSubImage) || (DE_NULL == m_gl_GetTextureSubImage))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Cannot obtain glGetCompressedTextureSubImage or glGetTextureSubImage function pointer."
				<< tcu::TestLog::EndMessage;
			throw 0;
		}

		/* Run tests. */
		if (is_at_least_gl_45 || is_arb_get_texture_sub_image)
		{
			/* Tested targets. */
			glw::GLenum targets[] = { GL_TEXTURE_1D,		GL_TEXTURE_1D_ARRAY, GL_TEXTURE_2D,
									  GL_TEXTURE_RECTANGLE, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_CUBE_MAP_ARRAY,
									  GL_TEXTURE_2D_ARRAY,  GL_TEXTURE_3D };

			glw::GLuint targets_count = sizeof(targets) / sizeof(targets[0]);

			for (glw::GLuint i = 0; i < targets_count; ++i)
			{
				prepare(targets[i], false);

				is_ok &= check(targets[i], false);

				clean();
			}

			/* Compressed textures tested targets. */
			glw::GLenum compressed_targets[] = { GL_TEXTURE_2D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_CUBE_MAP_ARRAY,
												 GL_TEXTURE_2D_ARRAY };

			glw::GLuint compressed_targets_count = sizeof(compressed_targets) / sizeof(compressed_targets[0]);

			for (glw::GLuint i = 0; i < compressed_targets_count; ++i)
			{
				prepare(compressed_targets[i], true);

				is_ok &= check(compressed_targets[i], true);

				clean();
			}
		}
	}
	catch (...)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test error has occured." << tcu::TestLog::EndMessage;

		is_ok	  = false;
		test_error = true;

		clean();
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}